

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Maybe<capnp::compiler::CompilerMain::Format> __thiscall
capnp::compiler::CompilerMain::parseFormatName(CompilerMain *this,StringPtr name)

{
  bool bVar1;
  ArrayPtr<const_char> local_28;
  ArrayPtr<const_char> local_18;
  
  local_18.ptr = (char *)name.content.size_;
  local_28.ptr = "binary";
  local_28.size_ = 7;
  bVar1 = kj::ArrayPtr<const_char>::operator==(&local_18,&local_28);
  if (bVar1) {
    *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
    *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 0;
  }
  else {
    local_28.ptr = "packed";
    local_28.size_ = 7;
    bVar1 = kj::ArrayPtr<const_char>::operator==(&local_18,&local_28);
    if (bVar1) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 1;
    }
    else {
      local_28.ptr = "flat";
      local_28.size_ = 5;
      bVar1 = kj::ArrayPtr<const_char>::operator==(&local_18,&local_28);
      if (bVar1) {
        *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
        *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 2;
      }
      else {
        local_28.ptr = "flat-packed";
        local_28.size_ = 0xc;
        bVar1 = kj::ArrayPtr<const_char>::operator==(&local_18,&local_28);
        if (bVar1) {
          *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
          *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) =
               3;
        }
        else {
          local_28.ptr = "canonical";
          local_28.size_ = 10;
          bVar1 = kj::ArrayPtr<const_char>::operator==(&local_18,&local_28);
          if (bVar1) {
            *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
            *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4)
                 = 4;
          }
          else {
            local_28.ptr = "text";
            local_28.size_ = 5;
            bVar1 = kj::ArrayPtr<const_char>::operator==(&local_18,&local_28);
            if (bVar1) {
              *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
              *(undefined4 *)
               ((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 5;
            }
            else {
              local_28.ptr = "json";
              local_28.size_ = 5;
              bVar1 = kj::ArrayPtr<const_char>::operator==(&local_18,&local_28);
              if (bVar1) {
                *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
                *(undefined4 *)
                 ((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 6;
              }
              else {
                *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 0;
              }
            }
          }
        }
      }
    }
  }
  return (Maybe<capnp::compiler::CompilerMain::Format>)
         (NullableValue<capnp::compiler::CompilerMain::Format>)this;
}

Assistant:

kj::Maybe<Format> parseFormatName(kj::StringPtr name) {
    if (name == "binary"     ) return Format::BINARY;
    if (name == "packed"     ) return Format::PACKED;
    if (name == "flat"       ) return Format::FLAT;
    if (name == "flat-packed") return Format::FLAT_PACKED;
    if (name == "canonical"  ) return Format::CANONICAL;
    if (name == "text"       ) return Format::TEXT;
    if (name == "json"       ) return Format::JSON;

    return kj::none;
  }